

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

SuspendedRequest * __thiscall
kj::_::NullableValue<kj::HttpServer::SuspendedRequest>::emplace<kj::HttpServer::SuspendedRequest>
          (NullableValue<kj::HttpServer::SuspendedRequest> *this,SuspendedRequest *params)

{
  uchar *puVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  
  if (this->isSet == true) {
    this->isSet = false;
    HttpHeaders::~HttpHeaders(&(this->field_1).value.headers);
    if ((this->field_1).value.method.tag == 1) {
      (this->field_1).value.method.tag = 0;
    }
    if ((this->field_1).value.method.tag == 2) {
      (this->field_1).value.method.tag = 0;
    }
    puVar1 = (this->field_1).value.buffer.ptr;
    if (puVar1 != (uchar *)0x0) {
      sVar2 = (this->field_1).value.buffer.size_;
      (this->field_1).value.buffer.ptr = (uchar *)0x0;
      (this->field_1).value.buffer.size_ = 0;
      pAVar3 = (this->field_1).value.buffer.disposer;
      (**pAVar3->_vptr_ArrayDisposer)(pAVar3,puVar1,1,sVar2,sVar2,0);
    }
  }
  (this->field_1).value.buffer.ptr = (params->buffer).ptr;
  (this->field_1).value.buffer.size_ = (params->buffer).size_;
  (this->field_1).value.buffer.disposer = (params->buffer).disposer;
  (params->buffer).ptr = (uchar *)0x0;
  (params->buffer).size_ = 0;
  sVar2 = (params->leftover).size_;
  (this->field_1).value.leftover.ptr = (params->leftover).ptr;
  (this->field_1).value.leftover.size_ = sVar2;
  (this->field_1).value.method.tag = (params->method).tag;
  if ((params->method).tag == 1) {
    *(undefined4 *)&(this->field_1).value.method.field_1 = *(undefined4 *)&(params->method).field_1;
  }
  sVar2 = (params->url).content.size_;
  (this->field_1).value.url.content.ptr = (params->url).content.ptr;
  (this->field_1).value.url.content.size_ = sVar2;
  HttpHeaders::HttpHeaders(&(this->field_1).value.headers,&params->headers);
  this->isSet = true;
  return (SuspendedRequest *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }